

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,BuiltIn builtin,StorageClass storage)

{
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  string *ts_1;
  CompilerError *this_00;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_41;
  string local_40;
  
  if (builtin == BuiltInSubgroupLocalInvocationId) {
    pcVar3 = "WaveGetLaneIndex()";
  }
  else if (builtin == BuiltInInstanceId) {
    pcVar3 = "gl_InstanceID";
  }
  else if (builtin == BuiltInPointCoord) {
    pcVar3 = "float2(0.5f, 0.5f)";
  }
  else if (builtin == BuiltInHelperInvocation) {
    pcVar3 = "IsHelperLane()";
  }
  else {
    if (builtin == BuiltInNumWorkgroups) {
      if (this->num_workgroups_builtin != 0) {
        pSVar1 = Compiler::get<spirv_cross::SPIRVariable>
                           ((Compiler *)this,this->num_workgroups_builtin);
        pSVar2 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,*(uint32_t *)&(pSVar1->super_IVariant).field_0xc);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_40,this,(ulong)this->num_workgroups_builtin,1);
        ts_1 = Compiler::get_member_name_abi_cxx11_
                         ((Compiler *)this,(TypeID)(pSVar2->super_IVariant).self.id,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&>
                  (__return_storage_ptr__,(spirv_cross *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3835c0,
                   (char (*) [2])ts_1,in_R8);
        ::std::__cxx11::string::~string((string *)&local_40);
        ParsedIR::sanitize_underscores(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,
                 "NumWorkgroups builtin is used, but remap_num_workgroups_builtin() was not called. Cannot emit code for this builtin."
                 ,&local_41);
      CompilerError::CompilerError(this_00,&local_40);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (builtin == BuiltInSubgroupSize) {
      pcVar3 = "WaveGetLaneCount()";
    }
    else {
      if (builtin != BuiltInVertexId) {
        CompilerGLSL::builtin_to_glsl_abi_cxx11_
                  (__return_storage_ptr__,&this->super_CompilerGLSL,builtin,storage);
        return __return_storage_ptr__;
      }
      pcVar3 = "gl_VertexID";
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::builtin_to_glsl(spv::BuiltIn builtin, spv::StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInVertexId:
		return "gl_VertexID";
	case BuiltInInstanceId:
		return "gl_InstanceID";
	case BuiltInNumWorkgroups:
	{
		if (!num_workgroups_builtin)
			SPIRV_CROSS_THROW("NumWorkgroups builtin is used, but remap_num_workgroups_builtin() was not called. "
			                  "Cannot emit code for this builtin.");

		auto &var = get<SPIRVariable>(num_workgroups_builtin);
		auto &type = get<SPIRType>(var.basetype);
		auto ret = join(to_name(num_workgroups_builtin), "_", get_member_name(type.self, 0));
		ParsedIR::sanitize_underscores(ret);
		return ret;
	}
	case BuiltInPointCoord:
		// Crude hack, but there is no real alternative. This path is only enabled if point_coord_compat is set.
		return "float2(0.5f, 0.5f)";
	case BuiltInSubgroupLocalInvocationId:
		return "WaveGetLaneIndex()";
	case BuiltInSubgroupSize:
		return "WaveGetLaneCount()";
	case BuiltInHelperInvocation:
		return "IsHelperLane()";

	default:
		return CompilerGLSL::builtin_to_glsl(builtin, storage);
	}
}